

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O3

ItemSource * __thiscall
WorldShuffler::place_item_randomly
          (WorldShuffler *this,Item *item,
          vector<ItemSource_*,_std::allocator<ItemSource_*>_> *possible_sources)

{
  Item **__src;
  pointer ppIVar1;
  ItemSource *source;
  bool bVar2;
  mapped_type_conflict2 *pmVar3;
  __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_> __dest;
  LandstalkerException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  Item **ppIVar6;
  pointer ppIVar7;
  Item *local_e0;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> *local_d8;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d0._M_dataplus._M_p._0_1_ = item->_id;
  local_e0 = item;
  pmVar3 = std::
           map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
           ::operator[](&this->_item_pool_quantities,(key_type_conflict *)&local_d0);
  if (*pmVar3 == 0) {
    return (ItemSource *)0x0;
  }
  vectools::shuffle<ItemSource*>(possible_sources,&this->_rng);
  ppIVar7 = (possible_sources->super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppIVar1 = (possible_sources->super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  local_d8 = possible_sources;
  while( true ) {
    if (ppIVar7 == ppIVar1) {
      this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
      std::operator+(&local_90,"Could not place ",&item->_name);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_90," in any of the ");
      local_b0._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar5 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == paVar5) {
        local_b0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      local_b0._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::to_string
                (&local_70,
                 (long)(local_d8->super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_d8->super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 3);
      std::operator+(&local_50,&local_b0,&local_70);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_50," possible sources.");
      local_d0._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar5 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p == paVar5) {
        local_d0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      local_d0._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      LandstalkerException::LandstalkerException(this_00,&local_d0);
      __cxa_throw(this_00,&LandstalkerException::typeinfo,
                  LandstalkerException::~LandstalkerException);
    }
    source = *ppIVar7;
    if ((source->_item == (Item *)0x0) &&
       (bVar2 = test_item_source_compatibility(this,source,item), bVar2)) break;
    ppIVar7 = ppIVar7 + 1;
  }
  (*source->_vptr_ItemSource[3])(source,item);
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<Item**,std::vector<Item*,std::allocator<Item*>>>,__gnu_cxx::__ops::_Iter_equals_val<Item*const>>
                     ((this->_item_pool).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (this->_item_pool).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl
                      .super__Vector_impl_data._M_finish,&local_e0);
  __src = __dest._M_current + 1;
  ppIVar6 = (this->_item_pool).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (__src != ppIVar6) {
    memmove(__dest._M_current,__src,(long)ppIVar6 - (long)__src);
    ppIVar6 = (this->_item_pool).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  (this->_item_pool).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppIVar6 + -1;
  local_d0._M_dataplus._M_p._0_1_ = local_e0->_id;
  pmVar3 = std::
           map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
           ::operator[](&this->_item_pool_quantities,(key_type_conflict *)&local_d0);
  *pmVar3 = *pmVar3 - 1;
  return source;
}

Assistant:

ItemSource* WorldShuffler::place_item_randomly(Item* item, std::vector<ItemSource*> possible_sources)
{
    if(_item_pool_quantities[item->id()] == 0)
        return nullptr;

    vectools::shuffle(possible_sources, _rng);

    ItemSource* picked_item_source = nullptr;
    for(ItemSource* source : possible_sources)
    {
        if(source->empty() && test_item_source_compatibility(source, item))
        {
            source->item(item);
            picked_item_source = source;
            break;
        }
    }

    if(!picked_item_source)
    {
        throw LandstalkerException("Could not place " + item->name() + " in any of the "
                                   + std::to_string(possible_sources.size()) + " possible sources.");
    }

    _item_pool.erase(std::find(_item_pool.begin(), _item_pool.end(), item));
    _item_pool_quantities[item->id()] -= 1;
    return picked_item_source;
}